

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

string * __thiscall sqlite::Connection::Stmt::bind_parameter_name_abi_cxx11_(Stmt *this,int index)

{
  char *pcVar1;
  string *what;
  string *sql;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  string *in_RDI;
  char *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator *paVar2;
  string *this_00;
  undefined4 in_stack_ffffffffffffff2c;
  int __val;
  string local_d0 [176];
  char *local_20;
  
  this_00 = in_RDI;
  pcVar1 = (char *)sqlite3_bind_parameter_name(*in_RSI,in_EDX);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    __val = CONCAT13(SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
                     CONCAT12(1,(short)in_stack_ffffffffffffff2c));
    what = (string *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::operator+(in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
    sql = (string *)sqlite3_errmsg(in_RSI[1]);
    std::operator+(in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
    pcVar1 = (char *)sqlite3_sql(*in_RSI);
    paVar2 = (allocator *)&stack0xffffffffffffff2f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar1,paVar2);
    Logic_error::Logic_error
              ((Logic_error *)this_00,what,sql,(int)((ulong)pcVar1 >> 0x20),(sqlite3 *)paVar2);
    __cxa_throw(what,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  paVar2 = (allocator *)&stack0xffffffffffffff2d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,pcVar1,paVar2);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2d);
  return in_RDI;
}

Assistant:

std::string Connection::Stmt::bind_parameter_name(const int index)
    {
        const char * name = sqlite3_bind_parameter_name(stmt_, index);
        if(!name)
        {
            throw Logic_error("Error looking up bind var name for index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), SQLITE_ERROR, db_);
        }
        return std::string(name);
    }